

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_descriptor.cpp
# Opt level: O0

void __thiscall
cfd::core::DescriptorKeyInfo::DescriptorKeyInfo
          (DescriptorKeyInfo *this,ExtPrivkey *ext_privkey,string *parent_key_information,
          string *path)

{
  ulong uVar1;
  char *pcVar2;
  ExtPrivkey *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  string local_58 [48];
  string *local_28;
  string *path_local;
  string *parent_key_information_local;
  ExtPrivkey *ext_privkey_local;
  DescriptorKeyInfo *this_local;
  
  this->key_type_ = kDescriptorKeyBip32Priv;
  __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          &this->schnorr_pubkey_;
  local_28 = path;
  path_local = parent_key_information;
  parent_key_information_local = (string *)ext_privkey;
  ext_privkey_local = (ExtPrivkey *)this;
  SchnorrPubkey::SchnorrPubkey((SchnorrPubkey *)__rhs);
  Pubkey::Pubkey(&this->pubkey_);
  this_00 = (ExtPrivkey *)&this->privkey_;
  Privkey::Privkey((Privkey *)this_00);
  ExtPrivkey::ExtPrivkey((ExtPrivkey *)parent_key_information,this_00);
  ExtPubkey::ExtPubkey(&this->extpubkey_);
  ::std::__cxx11::string::string((string *)&this->parent_info_);
  ::std::__cxx11::string::string((string *)&this->path_);
  ::std::__cxx11::string::string((string *)&this->key_string_);
  uVar1 = ::std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    ::std::__cxx11::string::operator=
              ((string *)&this->parent_info_,(string *)parent_key_information);
  }
  uVar1 = ::std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    pcVar2 = (char *)::std::__cxx11::string::operator[]((ulong)path);
    if (*pcVar2 == '/') {
      ::std::__cxx11::string::operator=((string *)&this->path_,(string *)path);
    }
    else {
      ::std::operator+((char *)this,__rhs);
      ::std::__cxx11::string::operator=((string *)&this->path_,local_58);
      ::std::__cxx11::string::~string(local_58);
    }
  }
  return;
}

Assistant:

DescriptorKeyInfo::DescriptorKeyInfo(
    const ExtPrivkey& ext_privkey, const std::string parent_key_information,
    const std::string path)
    : key_type_(DescriptorKeyType::kDescriptorKeyBip32Priv),
      extprivkey_(ext_privkey) {
  if (!parent_key_information.empty()) {
    parent_info_ = parent_key_information;
  }
  if (!path.empty()) {
    if (path[0] != '/') {
      path_ = "/" + path;
    } else {
      path_ = path;
    }
  }
}